

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O2

void print_fasta(FILE *fp,char *name,char *comment,char *seq,size_t colwidth)

{
  int iVar1;
  size_t sVar2;
  char *__ptr;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  sVar2 = strlen(seq);
  __ptr = (char *)malloc(colwidth + 1);
  if (__ptr != (char *)0x0) {
    if (colwidth < (ulong)(long)(int)sVar2) {
      if (comment == (char *)0x0) {
        fprintf((FILE *)fp,">%s\n",name);
      }
      else {
        fprintf((FILE *)fp,">%s %s\n",name,comment);
      }
      uVar5 = sVar2 & 0xffffffff;
      if ((int)sVar2 < 1) {
        uVar5 = 0;
      }
      uVar4 = 0;
      iVar1 = 0;
      while( true ) {
        uVar3 = (ulong)iVar1;
        if (uVar5 == uVar4) break;
        if (uVar3 < colwidth) {
          __ptr[uVar3] = seq[uVar4];
          iVar1 = iVar1 + 1;
        }
        else {
          __ptr[uVar3] = '\0';
          fprintf((FILE *)fp,"%s\n",__ptr);
          *__ptr = seq[uVar4];
          iVar1 = 1;
        }
        uVar4 = uVar4 + 1;
      }
      if (uVar3 < colwidth) {
        __ptr[uVar3] = '\0';
      }
      if (*__ptr != '\0') {
        fprintf((FILE *)fp,"%s\n",__ptr);
      }
    }
    else if (comment == (char *)0x0) {
      fprintf((FILE *)fp,">%s\n%s\n",name,seq);
    }
    else {
      fprintf((FILE *)fp,">%s %s\n%s\n",name,comment,seq);
    }
    free(__ptr);
    return;
  }
  fwrite("print_seq: out of memory for seqbuf!\n",0x25,1,_stderr);
  exit(1);
}

Assistant:

void print_fasta(FILE *fp, char *name, char *comment, char *seq, size_t colwidth)
{
	int l = strlen(seq);   /* sequence length */
	int x,i=0;
	char *seqbuf = NULL;
	seqbuf = (char *)malloc(sizeof(char) * (colwidth + 1));
	if (seqbuf == NULL) {
		fprintf(stderr,"print_seq: out of memory for seqbuf!\n");
		exit(EXIT_FAILURE);
	}

	if (l > colwidth) {                  /* seqlength is > column length - split sequence */
		if (comment == NULL)
			fprintf(fp, ">%s\n",name);
		else
			fprintf(fp, ">%s %s\n",name,comment);

		for (x=0; x<l;x++) {
			if (i < colwidth) {                     /* there's less sequence than the column width */
				seqbuf[i] = seq[x];
				i++;
			} else {                         /* i is >= column width, so print this line */
				seqbuf[i] = '\0';            /* set last position in string to null */
				fprintf(fp, "%s\n",seqbuf);       /* print this line */
				i = 0;                       /* reset i */
				seqbuf[0] = '\0';            /* reset buffer */
				seqbuf[i] = seq[x];   /* set this buffer line to current sequence char */
				i++;
			}
		}
		if (i<colwidth)
			seqbuf[i] = '\0';
		if (strlen(seqbuf) > 0)
			fprintf(fp, "%s\n",seqbuf);
	} else {                     /* seqlength < column length, so just print the full sequence */
		if (comment == NULL)
			fprintf(fp, ">%s\n%s\n",name,seq);
		else
			fprintf(fp, ">%s %s\n%s\n",name,comment,seq);
	}
	free(seqbuf);
}